

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history.c
# Opt level: O1

int history_def_first(void *p,HistEvent_conflict *ev)

{
  undefined8 *puVar1;
  char *pcVar2;
  
  puVar1 = *(undefined8 **)((long)p + 0x18);
  *(undefined8 **)((long)p + 0x28) = puVar1;
  if (puVar1 != (undefined8 *)p) {
    pcVar2 = (char *)puVar1[1];
    *(undefined8 *)ev = *puVar1;
    ev->str = pcVar2;
    return 0;
  }
  ev->num = 3;
  ev->str = "first event not found";
  return -1;
}

Assistant:

static int
history_def_first(void *p, TYPE(HistEvent) *ev)
{
	history_t *h = (history_t *) p;

	h->cursor = h->list.next;
	if (h->cursor != &h->list)
		*ev = h->cursor->ev;
	else {
		he_seterrev(ev, _HE_FIRST_NOTFOUND);
		return -1;
	}

	return 0;
}